

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O2

uint8_t * __thiscall
google::protobuf::io::EpsCopyOutputStream::WriteStringOutline
          (EpsCopyOutputStream *this,uint32_t num,string *s,uint8_t *ptr)

{
  uint size;
  uint8_t *puVar1;
  uint uVar2;
  LogMessageFatal aLStack_28 [16];
  
  puVar1 = EnsureSpace(this,ptr);
  if (puVar1 < this->end_) {
    size = (uint)s->_M_string_length;
    puVar1 = puVar1 + 2;
    for (uVar2 = num * 8 + 2; 0x7f < uVar2; uVar2 = uVar2 >> 7) {
      puVar1[-2] = (byte)uVar2 | 0x80;
      puVar1 = puVar1 + 1;
    }
    puVar1[-2] = (byte)uVar2;
    for (uVar2 = size; 0x7f < uVar2; uVar2 = uVar2 >> 7) {
      puVar1[-1] = (byte)uVar2 | 0x80;
      puVar1 = puVar1 + 1;
    }
    puVar1[-1] = (byte)uVar2;
    puVar1 = WriteRaw(this,(s->_M_dataplus)._M_p,size,puVar1);
    return puVar1;
  }
  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
            (aLStack_28,
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/io/coded_stream.h"
             ,0x355,10,"ptr < end_");
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(aLStack_28);
}

Assistant:

uint8_t* EpsCopyOutputStream::WriteStringOutline(uint32_t num, const std::string& s,
                                               uint8_t* ptr) {
  ptr = EnsureSpace(ptr);
  uint32_t size = s.size();
  ptr = WriteLengthDelim(num, size, ptr);
  return WriteRaw(s.data(), size, ptr);
}